

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quatf *q)

{
  undefined8 uVar1;
  double dVar2;
  long lVar3;
  mat<double,_3,_3> *pmVar4;
  matrix3d *pmVar5;
  byte bVar6;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  double3x3 m33;
  
  bVar6 = 0;
  uVar1 = *(undefined8 *)(q->imag)._M_elems;
  dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
  local_78._8_4_ = SUB84(dVar2,0);
  local_78._0_8_ = (double)(float)uVar1;
  local_78._12_4_ = (int)((ulong)dVar2 >> 0x20);
  uVar1 = *(undefined8 *)((q->imag)._M_elems + 2);
  dVar2 = (double)(float)((ulong)uVar1 >> 0x20);
  local_68._8_4_ = SUB84(dVar2,0);
  local_68._0_8_ = (double)(float)uVar1;
  local_68._12_4_ = (int)((ulong)dVar2 >> 0x20);
  linalg::qmat<double>(&m33,(vec<double,_4> *)local_78);
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  Identity(__return_storage_ptr__);
  pmVar4 = &m33;
  pmVar5 = __return_storage_ptr__;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    pmVar5->m[0][0] = (pmVar4->x).x;
    pmVar4 = (mat<double,_3,_3> *)((long)pmVar4 + (ulong)bVar6 * -0x10 + 8);
    pmVar5 = (matrix3d *)((long)pmVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quatf &q) {
  double3x3 m33 = linalg::qmat<double>({double(q.imag[0]), double(q.imag[1]),
                                        double(q.imag[2]), double(q.real)});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}